

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::ignore_case<CLI::App>(Option *this,bool value)

{
  bool bVar1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *this_00;
  pointer pOVar2;
  type this_01;
  OptionAlreadyAdded *this_02;
  string local_60;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  Option_p *opt;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  App *parent;
  bool value_local;
  Option *this_local;
  
  (this->super_OptionBase<CLI::Option>).ignore_case_ = value;
  this_00 = &this->parent_->options_;
  __end0 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(this_00);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt);
    if (!bVar1) {
      return this;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end0);
    pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_40);
    if (pOVar2 != this) {
      this_01 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator*(local_40)
      ;
      bVar1 = operator==(this_01,this);
      if (bVar1) {
        this_02 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_40);
        get_name_abi_cxx11_(&local_60,pOVar2,false);
        OptionAlreadyAdded::OptionAlreadyAdded(this_02,&local_60);
        __cxa_throw(this_02,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

Option *ignore_case(bool value = true) {
        ignore_case_ = value;
        auto *parent = dynamic_cast<T *>(parent_);

        for(const Option_p &opt : parent->options_)
            if(opt.get() != this && *opt == *this)
                throw OptionAlreadyAdded(opt->get_name());

        return this;
    }